

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

void idr_set_num(uchar *p,int num)

{
  ulong uVar1;
  
  *p = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[((ulong)(long)num % 0xb640) / 0x510];
  uVar1 = ((ulong)(long)num % 0xb640) % 0x510;
  p[1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar1 / 0x24];
  p[2] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar1 % 0x24];
  return;
}

Assistant:

static void
idr_set_num(unsigned char *p, int num)
{
	static const char xdig[] = {
		'0', '1', '2', '3', '4', '5', '6', '7', '8', '9',
		'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J',
		'K', 'L', 'M', 'N', 'O', 'P', 'Q', 'R', 'S', 'T',
		'U', 'V', 'W', 'X', 'Y', 'Z'
	};

	num %= sizeof(xdig) * sizeof(xdig) * sizeof(xdig);
	p[0] = xdig[(num / (sizeof(xdig) * sizeof(xdig)))];
	num %= sizeof(xdig) * sizeof(xdig);
	p[1] = xdig[ (num / sizeof(xdig))];
	num %= sizeof(xdig);
	p[2] = xdig[num];
}